

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_Utf16Surrogates_Test::~JsonString_Utf16Surrogates_Test
          (JsonString_Utf16Surrogates_Test *this)

{
  JsonString_Utf16Surrogates_Test *this_local;
  
  ~JsonString_Utf16Surrogates_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, Utf16Surrogates) {
    // Encoding for MUSICAL SYMBOL G CLEF (U+1D11E) expressed as a UTF-16
    // surrogate pair.
    EXPECT_CALL (callbacks_, string_value ("\xF0\x9D\x84\x9E")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input (R"("\uD834\uDD1E")").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{15U, 1U}));
}